

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

void cleanup_object_property(void)

{
  obj_property *poVar1;
  obj_property *prop;
  wchar_t idx;
  
  for (prop._4_4_ = 0; poVar1 = obj_properties, prop._4_4_ < (int)(uint)z_info->property_max;
      prop._4_4_ = prop._4_4_ + 1) {
    string_free(obj_properties[prop._4_4_].name);
    string_free(poVar1[prop._4_4_].adjective);
    string_free(poVar1[prop._4_4_].neg_adj);
    string_free(poVar1[prop._4_4_].msg);
    string_free(poVar1[prop._4_4_].desc);
  }
  mem_free(obj_properties);
  return;
}

Assistant:

static void cleanup_object_property(void)
{
	int idx;
	for (idx = 0; idx < z_info->property_max; idx++) {
		struct obj_property *prop = &obj_properties[idx];

		string_free(prop->name);
		string_free(prop->adjective);
		string_free(prop->neg_adj);
		string_free(prop->msg);
		string_free(prop->desc);
	}
	mem_free(obj_properties);
}